

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O2

bool Js::UriHelper::DecodeByteFromHex(char16 digit1,char16 digit2,uchar *value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  uint local_24 [2];
  int x;
  
  local_24[0] = (uint)((ulong)in_RAX >> 0x20);
  BVar3 = NumberUtilities::FHexDigit(digit1,(int *)local_24);
  if (BVar3 != 0) {
    if (0xf < local_24[0]) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0x240,"(static_cast<unsigned int>(x) <= 0xfU)",
                                  "static_cast<unsigned int>(x) <= 0xfU");
      if (!bVar2) goto LAB_00c15778;
      *puVar4 = 0;
    }
    *value = (char)local_24[0] << 4;
    BVar3 = NumberUtilities::FHexDigit(digit2,(int *)local_24);
    if (BVar3 != 0) {
      if (0xf < local_24[0]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                    ,0x247,"(static_cast<unsigned int>(x) <= 0xfU)",
                                    "static_cast<unsigned int>(x) <= 0xfU");
        if (!bVar2) {
LAB_00c15778:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      *value = *value + (char)local_24[0];
      return true;
    }
  }
  return false;
}

Assistant:

bool UriHelper::DecodeByteFromHex(const char16 digit1, const char16 digit2, unsigned char &value)
    {
        int x;
        if(!Js::NumberUtilities::FHexDigit(digit1, &x))
        {
            return false;
        }
        Assert(static_cast<unsigned int>(x) <= 0xfU);
        value = static_cast<unsigned char>(x) << 4;

        if(!Js::NumberUtilities::FHexDigit(digit2, &x))
        {
            return false;
        }
        Assert(static_cast<unsigned int>(x) <= 0xfU);
        value += static_cast<unsigned char>(x);

        return true;
    }